

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O1

CgreenVector * constraints_vector_from_va_list(__va_list_tag *constraints)

{
  uint uVar1;
  CgreenVector *vector;
  undefined8 *puVar2;
  
  vector = create_cgreen_vector(destroy_constraint);
  while( true ) {
    uVar1 = constraints->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar2 = (undefined8 *)((ulong)uVar1 + (long)constraints->reg_save_area);
      constraints->gp_offset = uVar1 + 8;
    }
    else {
      puVar2 = (undefined8 *)constraints->overflow_arg_area;
      constraints->overflow_arg_area = puVar2 + 1;
    }
    if ((void *)*puVar2 == (void *)0x0) break;
    cgreen_vector_add(vector,(void *)*puVar2);
  }
  return vector;
}

Assistant:

static CgreenVector *constraints_vector_from_va_list(va_list constraints) {
    CgreenVector *vector = create_constraints_vector();
    Constraint *constraint;
    while ((constraint = va_arg(constraints, Constraint *)) != (Constraint *)0) {
        cgreen_vector_add(vector, constraint);
    }
    return vector;
}